

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
  *pIVar1;
  int iVar2;
  uint uVar3;
  ID_index IVar4;
  Dimension DVar5;
  uint uVar6;
  undefined4 uVar7;
  _Manager_type p_Var8;
  bool bVar9;
  Index IVar10;
  pointer p;
  _Manager_type p_Var11;
  Column_support *__range2;
  _Manager_type p_Var12;
  bool bVar13;
  long lVar14;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
  *pIVar15;
  long lVar16;
  anon_class_1_0_00000001 local_3c;
  anon_class_1_0_00000001 local_3b;
  anon_class_1_0_00000001 local_3a;
  anon_class_1_0_00000001 local_39;
  anon_class_8_1_e4bd5e45 local_38;
  
  p_Var8 = this[1].deathComp_.super__Function_base._M_manager;
  lVar16 = (ulong)columnIndex1 * 0x30;
  if ((ulong)*(uint *)(p_Var8 + lVar16 + 8) == 0xffffffff) {
    bVar9 = false;
  }
  else {
    bVar9 = *(uint *)(p_Var8 + (ulong)*(uint *)(p_Var8 + lVar16 + 8) * 0x30 + 4) <
            *(uint *)(p_Var8 + lVar16 + 4);
  }
  lVar14 = (ulong)columnIndex2 * 0x30;
  if ((ulong)*(uint *)(p_Var8 + lVar14 + 8) == 0xffffffff) {
    bVar13 = false;
  }
  else {
    bVar13 = *(uint *)(p_Var8 + (ulong)*(uint *)(p_Var8 + lVar14 + 8) * 0x30 + 4) <
             *(uint *)(p_Var8 + lVar14 + 4);
  }
  p_Var12 = this[1].deathComp_.super__Function_base._M_manager;
  iVar2 = *(int *)(p_Var12 + lVar16 + 4);
  p_Var12 = p_Var12 + lVar14 + 0x20;
  p_Var11 = p_Var12;
  if ((bool)(bVar9 & bVar13)) {
    do {
      p_Var11 = *(_Manager_type *)p_Var11;
      if (p_Var11 == p_Var12) {
        return columnIndex1;
      }
      if (p_Var11 == (_Manager_type)0x0) {
LAB_001a7c1b:
        __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                      "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, false, true>>::Matrix_column_tag, Type = 1]"
                     );
      }
    } while (*(int *)(p_Var11 + 0x10) != iVar2);
    if (p_Var11 != p_Var12) {
      IVar10 = _negative_vine_swap(this,columnIndex1,columnIndex2);
      return IVar10;
    }
  }
  else if (bVar9) {
    do {
      p_Var11 = *(_Manager_type *)p_Var11;
      if (p_Var11 == p_Var12) {
        return columnIndex1;
      }
      if (p_Var11 == (_Manager_type)0x0) goto LAB_001a7c1b;
    } while (*(int *)(p_Var11 + 0x10) != iVar2);
    if (p_Var11 != p_Var12) {
      pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
                *)(p_Var8 + lVar16);
      uVar3 = *(uint *)(p_Var8 + lVar16 + 4);
      pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
                 *)(p_Var8 + lVar14);
      local_38.targetColumn = pIVar1;
      bVar9 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column___persistence_matrix::Column_types)7,true,false,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                        (pIVar15,pIVar1,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
      if (bVar9) {
        IVar4 = (pIVar1->super_Chain_column_option).pivot_;
        (pIVar1->super_Chain_column_option).pivot_ = (pIVar15->super_Chain_column_option).pivot_;
        (pIVar15->super_Chain_column_option).pivot_ = IVar4;
        DVar5 = (pIVar1->super_Column_dimension_option).dim_;
        (pIVar1->super_Column_dimension_option).dim_ = (pIVar15->super_Column_dimension_option).dim_
        ;
        (pIVar15->super_Column_dimension_option).dim_ = DVar5;
      }
      uVar6 = (pIVar1->super_Chain_column_option).pivot_;
      columnIndex1 = columnIndex2;
      if (uVar3 != uVar6) {
        lVar16 = *(long *)((long)&this[2].birthComp_.super__Function_base._M_functor + 8);
        uVar7 = *(undefined4 *)(lVar16 + (ulong)uVar3 * 4);
        *(undefined4 *)(lVar16 + (ulong)uVar3 * 4) = *(undefined4 *)(lVar16 + (ulong)uVar6 * 4);
        *(undefined4 *)(lVar16 + (ulong)uVar6 * 4) = uVar7;
      }
    }
  }
  else if (bVar13) {
    do {
      p_Var11 = *(_Manager_type *)p_Var11;
      if (p_Var11 == p_Var12) {
        return columnIndex1;
      }
      if (p_Var11 == (_Manager_type)0x0) goto LAB_001a7c1b;
    } while (*(int *)(p_Var11 + 0x10) != iVar2);
    if (p_Var11 != p_Var12) {
      pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
                *)(p_Var8 + lVar14);
      uVar3 = *(uint *)(p_Var8 + lVar14 + 4);
      pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true>_>_>
                 *)(p_Var8 + lVar16);
      local_38.targetColumn = pIVar1;
      bVar9 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column___persistence_matrix::Column_types)7,true,false,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                        (pIVar15,pIVar1,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
      if (bVar9) {
        IVar4 = (pIVar1->super_Chain_column_option).pivot_;
        (pIVar1->super_Chain_column_option).pivot_ = (pIVar15->super_Chain_column_option).pivot_;
        (pIVar15->super_Chain_column_option).pivot_ = IVar4;
        DVar5 = (pIVar1->super_Column_dimension_option).dim_;
        (pIVar1->super_Column_dimension_option).dim_ = (pIVar15->super_Column_dimension_option).dim_
        ;
        (pIVar15->super_Column_dimension_option).dim_ = DVar5;
      }
      uVar6 = (pIVar1->super_Chain_column_option).pivot_;
      if (uVar3 != uVar6) {
        lVar16 = *(long *)((long)&this[2].birthComp_.super__Function_base._M_functor + 8);
        uVar7 = *(undefined4 *)(lVar16 + (ulong)uVar3 * 4);
        *(undefined4 *)(lVar16 + (ulong)uVar3 * 4) = *(undefined4 *)(lVar16 + (ulong)uVar6 * 4);
        *(undefined4 *)(lVar16 + (ulong)uVar6 * 4) = uVar7;
      }
    }
  }
  else {
    do {
      p_Var11 = *(_Manager_type *)p_Var11;
      if (p_Var11 == p_Var12) {
        return columnIndex1;
      }
      if (p_Var11 == (_Manager_type)0x0) goto LAB_001a7c1b;
    } while (*(int *)(p_Var11 + 0x10) != iVar2);
    if (p_Var11 != p_Var12) {
      IVar10 = _positive_vine_swap(this,columnIndex1,columnIndex2);
      return IVar10;
    }
  }
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}